

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientFeederApplication.h
# Opt level: O0

void __thiscall
ClientFeederApplication::ClientFeederApplication
          (ClientFeederApplication *this,Logger<std::shared_ptr<spdlog::logger>_> *logger,
          AppConfig *configs)

{
  Logger<std::shared_ptr<spdlog::logger>_> *in_RDI;
  Logger<std::shared_ptr<spdlog::logger>_> *this_00;
  
  this_00 = in_RDI;
  LogManager::Logger<std::shared_ptr<spdlog::logger>_>::Logger(in_RDI,in_RDI);
  ConfigManager::Configurations::AppConfig::AppConfig((AppConfig *)this_00,(AppConfig *)in_RDI);
  std::atomic<bool>::atomic((atomic<bool> *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

ClientFeederApplication(LogManager::Logger<std::shared_ptr<spdlog::logger>>& logger,
                            ConfigManager::Configurations::AppConfig& configs) :
        m_logger(logger),
        m_configs(configs),
        m_continue(true)
    {}